

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O2

void __thiscall
cmDynamicLoaderCache::CacheFile(cmDynamicLoaderCache *this,char *path,LibraryHandle *p)

{
  mapped_type pvVar1;
  bool bVar2;
  mapped_type *ppvVar3;
  LibraryHandle h;
  allocator local_49;
  LibraryHandle local_48;
  key_type local_40;
  
  bVar2 = GetCacheFile(this,path,&local_48);
  if (bVar2) {
    FlushCache(this,path);
  }
  pvVar1 = *p;
  std::__cxx11::string::string((string *)&local_40,path,&local_49);
  ppvVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
            ::operator[](&this->CacheMap,&local_40);
  *ppvVar3 = pvVar1;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmDynamicLoaderCache::CacheFile(const char* path,
  const cmsys::DynamicLoader::LibraryHandle& p)
{
  cmsys::DynamicLoader::LibraryHandle h;
  if ( this->GetCacheFile(path, h) )
    {
    this->FlushCache(path);
    }
  this->CacheMap[path] = p;
}